

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridGlobal.cpp
# Opt level: O0

void __thiscall
TasGrid::GridGlobal::updateGrid
          (GridGlobal *this,int depth,TypeDepth type,
          vector<int,_std::allocator<int>_> *anisotropic_weights,
          vector<int,_std::allocator<int>_> *level_limits)

{
  bool bVar1;
  MultiIndexSet local_88;
  MultiIndexSet local_50;
  vector<int,_std::allocator<int>_> *local_28;
  vector<int,_std::allocator<int>_> *level_limits_local;
  vector<int,_std::allocator<int>_> *anisotropic_weights_local;
  TypeDepth type_local;
  int depth_local;
  GridGlobal *this_local;
  
  local_28 = level_limits;
  level_limits_local = anisotropic_weights;
  anisotropic_weights_local._0_4_ = type;
  anisotropic_weights_local._4_4_ = depth;
  _type_local = this;
  if (((this->super_BaseCanonicalGrid).num_outputs == 0) ||
     (bVar1 = MultiIndexSet::empty(&(this->super_BaseCanonicalGrid).points), bVar1)) {
    makeGrid(this,(this->super_BaseCanonicalGrid).num_dimensions,
             (this->super_BaseCanonicalGrid).num_outputs,anisotropic_weights_local._4_4_,
             (TypeDepth)anisotropic_weights_local,this->rule,level_limits_local,this->alpha,
             this->beta,(char *)0x0,local_28);
  }
  else {
    (*(this->super_BaseCanonicalGrid)._vptr_BaseCanonicalGrid[0x18])();
    selectTensors(&local_50,this,(long)(this->super_BaseCanonicalGrid).num_dimensions,
                  anisotropic_weights_local._4_4_,(TypeDepth)anisotropic_weights_local,
                  level_limits_local,this->rule,local_28);
    MultiIndexSet::operator=(&this->updated_tensors,&local_50);
    MultiIndexSet::~MultiIndexSet(&local_50);
    MultiIndexSet::operator-(&local_88,&this->updated_tensors,&this->tensors);
    bVar1 = MultiIndexSet::empty(&local_88);
    MultiIndexSet::~MultiIndexSet(&local_88);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      MultiIndexSet::operator+=(&this->updated_tensors,&this->tensors);
      proposeUpdatedTensors(this);
    }
  }
  return;
}

Assistant:

void GridGlobal::updateGrid(int depth, TypeDepth type, const std::vector<int> &anisotropic_weights, const std::vector<int> &level_limits){
    if ((num_outputs == 0) || points.empty()){
        makeGrid(num_dimensions, num_outputs, depth, type, rule, anisotropic_weights, alpha, beta, 0, level_limits);
    }else{
        clearRefinement();

        updated_tensors = selectTensors((size_t) num_dimensions, depth, type, anisotropic_weights, rule, level_limits);

        if (!(updated_tensors - tensors).empty()){
            updated_tensors += tensors;
            proposeUpdatedTensors();
        }
    }
}